

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::gauss_newton
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  Scalar *pSVar1;
  long in_RCX;
  int i;
  int k;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_4,_1,_0,_4,_1> *in_stack_00000048;
  Matrix<double,_6,_1,_0,_6,_1> B;
  Matrix<double,_6,_4,_0,_6,_4> A;
  int iterations_number;
  Index in_stack_fffffffffffffe40;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *in_stack_fffffffffffffe48;
  undefined4 local_1a8;
  undefined4 local_1a4;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_ffffffffffffff40;
  Matrix<double,_6,_4,_0,_6,_4> *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_ffffffffffffff58;
  Matrix<double,_6,_10,_0,_6,_10> *in_stack_ffffffffffffff60;
  Epnp *in_stack_ffffffffffffff68;
  
  Eigen::Matrix<double,_6,_4,_0,_6,_4>::Matrix((Matrix<double,_6,_4,_0,_6,_4> *)0x8d1a74);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)0x8d1a7e);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x8d1a88);
  for (local_1a4 = 0; local_1a4 < 5; local_1a4 = local_1a4 + 1) {
    compute_A_and_b_gauss_newton
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    qr_solve((Epnp *)B.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[2],
             (Matrix<double,_6,_4,_0,_6,_4> *)
             B.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1],(Matrix<double,_6,_1,_0,_6,_1> *)
                 B.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0],in_stack_00000048);
    for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      *(double *)(in_RCX + (long)local_1a8 * 8) =
           *pSVar1 + *(double *)(in_RCX + (long)local_1a8 * 8);
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::gauss_newton(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double betas[4])
{
  const int iterations_number = 5;

  Eigen::Matrix<double,6,4> A;
  Eigen::Matrix<double,6,1> B;
  Eigen::Matrix<double,4,1> X;

  for(int k = 0; k < iterations_number; k++)
  {
    compute_A_and_b_gauss_newton(L_6x10,Rho,betas,A,B);
    qr_solve(A,B,X);

    for(int i = 0; i < 4; i++)
      betas[i] += X[i];
  }
}